

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void AttributeChecks(TidyDocImpl *doc,Node *node)

{
  Node *pNVar1;
  Bool BVar2;
  bool bVar3;
  Node *next;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  next = node;
  do {
    if (next == (Node *)0x0) {
      return;
    }
    pNVar1 = next->next;
    BVar2 = prvTidynodeIsElement(next);
    if (BVar2 != no) {
      if ((next->tag == (Dict *)0x0) || (next->tag->chkattrs == (CheckAttribs *)0x0)) {
        prvTidyCheckAttributes(doc,next);
      }
      else {
        (*next->tag->chkattrs)(doc,next);
      }
    }
    if (next->content != (Node *)0x0) {
      AttributeChecks(doc,next->content);
    }
    bVar3 = pNVar1 != next;
    next = pNVar1;
  } while (bVar3);
  __assert_fail("next != node",
                "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/parser.c",
                0x168b,"void AttributeChecks(TidyDocImpl *, Node *)");
}

Assistant:

static void AttributeChecks(TidyDocImpl* doc, Node* node)
{
    Node *next;

    while (node)
    {
        next = node->next;

        if (TY_(nodeIsElement)(node))
        {
            if (node->tag && node->tag->chkattrs) /* [i_a]2 fix crash after adding SVG support with alt/unknown tag subtree insertion there */
                node->tag->chkattrs(doc, node);
            else
                TY_(CheckAttributes)(doc, node);
        }

        if (node->content)
            AttributeChecks(doc, node->content);

        assert( next != node ); /* http://tidy.sf.net/issue/1603538 */
        node = next;
    }
}